

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O0

int __thiscall
soul::Optimisations::Inliner::clone
          (Inliner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *this_00;
  mapped_type *this_01;
  Block *args;
  Branch *pBVar1;
  Branch *old_local;
  Inliner *this_local;
  
  this_00 = this->module;
  this_01 = std::
            unordered_map<soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>,_std::hash<soul::pool_ref<soul::heart::Block>_>,_std::equal_to<soul::pool_ref<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>_>
            ::operator[](&this->remappedBlocks,(key_type *)(__fn + 0x18));
  args = pool_ptr<soul::heart::Block>::operator*(this_01);
  pBVar1 = Module::allocate<soul::heart::Branch,soul::heart::Block&>(this_00,args);
  return (int)pBVar1;
}

Assistant:

heart::Branch& clone (const heart::Branch& old)
        {
            return module.allocate<heart::Branch> (*remappedBlocks[old.target]);
        }